

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling_sse2.c
# Opt level: O1

void Yuv444ToRgb565_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  uint8_t *dst_00;
  int len_00;
  ulong uVar1;
  
  if ((int)(len & 0xffffffe0U) < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    dst_00 = dst;
    do {
      VP8YuvToRgb56532_SSE2(y + uVar1,u + uVar1,v + uVar1,dst_00);
      uVar1 = uVar1 + 0x20;
      dst_00 = dst_00 + 0x40;
    } while (uVar1 < (len & 0xffffffe0U));
  }
  len_00 = len - (int)uVar1;
  if (len_00 == 0 || len < (int)uVar1) {
    return;
  }
  uVar1 = uVar1 & 0xffffffff;
  WebPYuv444ToRgb565_C(y + uVar1,u + uVar1,v + uVar1,dst + uVar1 * 2,len_00);
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void WebPInitYUV444ConvertersSSE2(void) {
  WebPYUV444Converters[MODE_RGBA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_BGRA]      = Yuv444ToBgra_SSE2;
  WebPYUV444Converters[MODE_rgbA]      = Yuv444ToRgba_SSE2;
  WebPYUV444Converters[MODE_bgrA]      = Yuv444ToBgra_SSE2;
#if !defined(WEBP_REDUCE_CSP)
  WebPYUV444Converters[MODE_RGB]       = Yuv444ToRgb_SSE2;
  WebPYUV444Converters[MODE_BGR]       = Yuv444ToBgr_SSE2;
  WebPYUV444Converters[MODE_ARGB]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_RGBA_4444] = Yuv444ToRgba4444_SSE2;
  WebPYUV444Converters[MODE_RGB_565]   = Yuv444ToRgb565_SSE2;
  WebPYUV444Converters[MODE_Argb]      = Yuv444ToArgb_SSE2;
  WebPYUV444Converters[MODE_rgbA_4444] = Yuv444ToRgba4444_SSE2;
#endif   // WEBP_REDUCE_CSP
}